

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CoverageBinsArraySizeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsArraySizeSyntax,slang::syntax::CoverageBinsArraySizeSyntax_const&>
          (BumpAllocator *this,CoverageBinsArraySizeSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  ExpressionSyntax *pEVar4;
  Info *pIVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  CoverageBinsArraySizeSyntax *pCVar15;
  
  pCVar15 = (CoverageBinsArraySizeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverageBinsArraySizeSyntax *)this->endPtr < pCVar15 + 1) {
    pCVar15 = (CoverageBinsArraySizeSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pCVar15 + 1);
  }
  SVar13 = (args->super_SyntaxNode).kind;
  uVar14 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar9 = (args->openBracket).kind;
  uVar10 = (args->openBracket).field_0x2;
  NVar11.raw = (args->openBracket).numFlags.raw;
  uVar12 = (args->openBracket).rawLen;
  pIVar3 = (args->openBracket).info;
  pEVar4 = args->expr;
  uVar6 = (args->closeBracket).field_0x2;
  NVar7.raw = (args->closeBracket).numFlags.raw;
  uVar8 = (args->closeBracket).rawLen;
  pIVar5 = (args->closeBracket).info;
  (pCVar15->closeBracket).kind = (args->closeBracket).kind;
  (pCVar15->closeBracket).field_0x2 = uVar6;
  (pCVar15->closeBracket).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar15->closeBracket).rawLen = uVar8;
  (pCVar15->closeBracket).info = pIVar5;
  (pCVar15->openBracket).info = pIVar3;
  pCVar15->expr = pEVar4;
  (pCVar15->super_SyntaxNode).previewNode = pSVar2;
  (pCVar15->openBracket).kind = TVar9;
  (pCVar15->openBracket).field_0x2 = uVar10;
  (pCVar15->openBracket).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar15->openBracket).rawLen = uVar12;
  (pCVar15->super_SyntaxNode).kind = SVar13;
  *(undefined4 *)&(pCVar15->super_SyntaxNode).field_0x4 = uVar14;
  (pCVar15->super_SyntaxNode).parent = pSVar1;
  return pCVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }